

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall Catch::Session::runInternal(Session *this)

{
  size_type *psVar1;
  element_type *peVar2;
  long lVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  pointer this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _func_int **pp_Var6;
  TestCase **ppTVar7;
  TestCase *pTVar8;
  pointer pTVar9;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> _Var10;
  shared_ptr<Catch::Config> *psVar11;
  undefined8 uVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar16;
  undefined4 extraout_var;
  long *plVar17;
  long lVar18;
  ulong uVar19;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  _Base_ptr p_Var20;
  int iVar21;
  const_iterator __begin3;
  undefined1 auVar22 [8];
  TestCase *pTVar23;
  pointer *__ptr;
  size_t sVar24;
  TestCase **__v;
  pointer ppTVar25;
  FilterMatch *match;
  pointer pbVar26;
  pointer pTVar27;
  pointer *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  Totals totals;
  string filename;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_338;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_330;
  undefined1 local_328 [16];
  FilterMatch local_318;
  size_t sStack_2e0;
  undefined1 local_2d8 [8];
  undefined1 auStack_2d0 [16];
  undefined1 auStack_2c0 [16];
  undefined1 auStack_2b0 [16];
  vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
  *local_298;
  size_t sStack_290;
  shared_ptr<Catch::Config> *local_280;
  undefined1 local_278 [240];
  long *local_188;
  ulong local_168;
  long *local_140;
  _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
  local_78 [8];
  undefined4 local_70 [2];
  undefined8 local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  undefined1 local_50 [8];
  undefined1 auStack_48 [8];
  undefined1 local_40 [16];
  
  if (this->m_startupExceptions != false) {
    return 1;
  }
  if ((this->m_configData).showHelp != false) {
    return 0;
  }
  if ((this->m_configData).libIdentify != false) {
    return 0;
  }
  config(this);
  seedRng(&((this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_IConfig);
  local_280 = &this->m_config;
  if ((this->m_configData).filenamesAsTags == true) {
    peVar2 = (local_280->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pSVar16 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar14 = (*(pSVar16->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar16);
    plVar17 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar14) + 0x18))
                                ((long *)CONCAT44(extraout_var,iVar14),peVar2);
    lVar3 = plVar17[1];
    if (*plVar17 != lVar3) {
      __x = (pointer *)(*plVar17 + 0x60);
      do {
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_328,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)__x);
        std::__cxx11::string::string
                  ((string *)local_278,
                   (char *)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(__x + 6))->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,(allocator *)&local_338);
        lVar18 = std::__cxx11::string::find_last_of((char *)local_278,0x1a7ef3,0xffffffffffffffff);
        if (lVar18 != -1) {
          std::__cxx11::string::erase((ulong)local_278,0);
          *(char *)local_278._0_8_ = '#';
        }
        uVar19 = std::__cxx11::string::rfind
                           ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_278,0x2e);
        if (uVar19 != 0xffffffffffffffff) {
          if ((ulong)local_278._8_8_ < uVar19) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                       "basic_string::erase",uVar19);
          }
          *(char *)(local_278._0_8_ + uVar19) = '\0';
          local_278._8_8_ = uVar19;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2d8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_328);
        setTags((TestCaseInfo *)(__x + -0xc),
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2d8);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2d8);
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_);
        }
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_328);
        lVar18 = (long)(__x + 0xb);
        __x = __x + 0x17;
      } while (lVar18 != lVar3);
    }
  }
  list((Catch *)local_278,local_280);
  if ((int *)local_278._0_8_ != (int *)0x0) {
    return *(int *)local_278._0_8_;
  }
  local_278._0_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_278._8_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count + 1;
    }
  }
  local_2d8 = (undefined1  [8])
              (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auStack_2d0._0_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_2d0._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_2d0._0_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_2d0._0_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_2d0._0_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_2d0._0_8_)->_M_use_count + 1;
    }
  }
  pSVar16 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar14 = (*(pSVar16->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar16);
  plVar17 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar14) + 0x20))
                              ((long *)CONCAT44(extraout_var_00,iVar14));
  if (*plVar17 == plVar17[1]) {
    peVar2 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var5 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    local_328 = *(undefined1 (*) [16])
                 &(this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    anon_unknown_1::createReporter
              ((anon_unknown_1 *)&local_330,&(peVar2->m_data).reporterName,(IConfigPtr *)local_328);
  }
  else {
    local_330._M_head_impl = (IStreamingReporter *)operator_new(0x30);
    (local_330._M_head_impl)->_vptr_IStreamingReporter =
         (_func_int **)&PTR__ListeningReporter_001cb4c0;
    *(undefined1 (*) [16])(local_330._M_head_impl + 1) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(local_330._M_head_impl + 3) = (undefined1  [16])0x0;
    *(undefined2 *)&local_330._M_head_impl[5]._vptr_IStreamingReporter = 0x100;
    local_318.tests.
    super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_330._M_head_impl;
    pSVar16 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar14 = (*(pSVar16->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar16);
    plVar17 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar14) + 0x20))
                                ((long *)CONCAT44(extraout_var_01,iVar14));
    ppTVar25 = (pointer)*plVar17;
    local_318.tests.
    super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)plVar17[1];
    if (ppTVar25 !=
        local_318.tests.
        super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_298 = (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                   *)(local_318.tests.
                      super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 1);
      do {
        pTVar23 = *ppTVar25;
        _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
        this_00 = (pointer)(this->m_config).
                           super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi;
        if (this_00 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &(this_00->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &(this_00->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        local_328._0_4_ =
             (*(((IConfig *)&(_Var4._M_pi)->_vptr__Sp_counted_base)->super_NonCopyable).
               _vptr_NonCopyable[3])(_Var4._M_pi);
        local_328._4_4_ = extraout_var_02;
        local_328._8_8_ = _Var4._M_pi;
        if (this_00 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &(this_00->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &(this_00->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        local_318.name._M_dataplus._M_p = (pointer)this_00;
        (**(code **)((pTVar23->super_TestCaseInfo).name._M_dataplus._M_p + 0x10))
                  (&local_338,pTVar23,local_328);
        std::
        vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
        ::
        emplace_back<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>
                  (local_298,
                   (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                    *)&local_338);
        if (local_338._M_head_impl != (IStreamingReporter *)0x0) {
          (*(local_338._M_head_impl)->_vptr_IStreamingReporter[1])();
        }
        local_338._M_head_impl = (IStreamingReporter *)0x0;
        if ((pointer)local_318.name._M_dataplus._M_p != (pointer)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318.name._M_dataplus._M_p
                    );
        }
        if (this_00 != (pointer)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
        ppTVar25 = ppTVar25 + 2;
      } while (ppTVar25 !=
               local_318.tests.
               super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    ppTVar25 = local_318.tests.
               super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    peVar2 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var5 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    local_328 = *(undefined1 (*) [16])
                 &(this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    anon_unknown_1::createReporter
              ((anon_unknown_1 *)&local_338,&(peVar2->m_data).reporterName,(IConfigPtr *)local_328);
    _Var10._M_head_impl = local_338._M_head_impl;
    local_338._M_head_impl = (IStreamingReporter *)0x0;
    pp_Var6 = ((IStreamingReporter *)(ppTVar25 + 4))->_vptr_IStreamingReporter;
    ((IStreamingReporter *)(ppTVar25 + 4))->_vptr_IStreamingReporter =
         (_func_int **)_Var10._M_head_impl;
    if (pp_Var6 != (_func_int **)0x0) {
      (**(code **)(*pp_Var6 + 8))();
    }
    bVar13 = (**(code **)(*((IStreamingReporter *)(ppTVar25 + 4))->_vptr_IStreamingReporter + 0x10))
                       ();
    *(byte *)&((IStreamingReporter *)(ppTVar25 + 5))->_vptr_IStreamingReporter = bVar13 & 1;
    if (local_338._M_head_impl != (IStreamingReporter *)0x0) {
      (*(local_338._M_head_impl)->_vptr_IStreamingReporter[1])();
    }
    local_338._M_head_impl = (IStreamingReporter *)0x0;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
  }
  RunContext::RunContext
            ((RunContext *)(local_278 + 0x10),(IConfigPtr *)local_2d8,
             (IStreamingReporterPtr *)&local_330);
  if (local_330._M_head_impl != (IStreamingReporter *)0x0) {
    (*(local_330._M_head_impl)->_vptr_IStreamingReporter[1])();
  }
  if ((pointer)auStack_2d0._0_8_ != (pointer)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_2d0._0_8_);
  }
  uVar12 = local_278._0_8_;
  local_70[0] = 0;
  local_68 = 0;
  _local_50 = (undefined1  [16])0x0;
  local_40 = (undefined1  [16])0x0;
  local_60 = (_Base_ptr)local_70;
  local_58 = (_Base_ptr)local_70;
  pSVar16 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar14 = (*(pSVar16->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar16);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar14) + 0x18))
                        ((long *)CONCAT44(extraout_var_03,iVar14),uVar12);
  iVar14 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  TestSpec::matchesByFilter
            ((Matches *)local_2d8,(TestSpec *)CONCAT44(extraout_var_04,iVar14),testCases,
             (IConfig *)local_278._0_8_);
  local_328._0_8_ = auStack_48;
  local_328._8_8_ = local_40._0_8_;
  local_318.name._M_dataplus._M_p = (pointer)local_40._8_8_;
  auStack_48 = local_2d8;
  local_40 = auStack_2d0;
  local_2d8 = (undefined1  [8])0x0;
  auStack_2d0 = ZEXT816(0);
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          local_328);
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          local_2d8);
  iVar14 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  local_318.tests.
  super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_40._0_8_;
  if (auStack_48 == (undefined1  [8])local_40._0_8_) {
    if (*(long *)(CONCAT44(extraout_var_05,iVar14) + 0x18) ==
        *(long *)(CONCAT44(extraout_var_05,iVar14) + 0x20)) {
      pTVar27 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar9 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar27 != pTVar9) {
        do {
          if (((pTVar27->super_TestCaseInfo).properties & IsHidden) == None) {
            local_328._0_8_ = pTVar27;
            std::
            _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
            ::_M_emplace_unique<Catch::TestCase_const*>(local_78,(TestCase **)local_328);
          }
          pTVar27 = pTVar27 + 1;
        } while (pTVar27 != pTVar9);
      }
      goto LAB_0016bae9;
    }
    if (auStack_48 == (undefined1  [8])local_40._0_8_) goto LAB_0016bae9;
  }
  auVar22 = auStack_48;
  do {
    __v = *(TestCase ***)&(((element_type *)auVar22)->m_data).benchmarkSamples;
    ppTVar7 = (TestCase **)(((element_type *)auVar22)->m_data).benchmarkConfidenceInterval;
    local_328._0_8_ = local_78;
    for (; __v != ppTVar7; __v = __v + 1) {
      std::
      _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
      ::
      _M_insert_unique_<Catch::TestCase_const*const&,std::_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>::_Alloc_node>
                (local_78,(_Base_ptr)local_70,__v,(_Alloc_node *)local_328);
    }
    auVar22 = (undefined1  [8])&(((element_type *)auVar22)->m_data).benchmarkWarmupTime;
  } while (auVar22 !=
           (undefined1  [8])
           local_318.tests.
           super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_0016bae9:
  iVar14 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  local_2d8 = (undefined1  [8])((ulong)local_2d8 & 0xffffffff00000000);
  auStack_2d0 = (undefined1  [16])0x0;
  auStack_2c0 = (undefined1  [16])0x0;
  auStack_2b0 = (undefined1  [16])0x0;
  (**(code **)(*(long *)local_278._0_8_ + 0x20))(local_328);
  RunContext::testGroupStarting((RunContext *)(local_278 + 0x10),(string *)local_328,1,1);
  local_318.tests.
  super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)CONCAT44(extraout_var_06,iVar14);
  if ((FilterMatch *)local_328._0_8_ != &local_318) {
    operator_delete((void *)local_328._0_8_);
  }
  pbVar26 = (pointer)auStack_2d0._0_8_;
  if (local_60 != (_Base_ptr)local_70) {
    local_318.tests.
    super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)auStack_2d0._8_8_;
    sStack_2e0 = auStack_2c0._0_8_;
    local_298 = (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                 *)auStack_2c0._8_8_;
    sStack_290 = auStack_2b0._0_8_;
    p_Var20 = local_60;
    sVar24 = auStack_2b0._8_8_;
    do {
      uVar19 = local_168;
      iVar14 = (**(code **)(*local_188 + 0x48))();
      if (uVar19 < (ulong)(long)iVar14) {
        RunContext::runTest((Totals *)local_328,(RunContext *)(local_278 + 0x10),
                            *(TestCase **)(p_Var20 + 1));
        pbVar26 = (pointer)((long)&(pbVar26->_M_dataplus)._M_p + local_328._8_8_);
        local_318.tests.
        super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&(((IConfig *)
                               local_318.tests.
                               super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                              super_NonCopyable)._vptr_NonCopyable +
                      (long)local_318.name._M_dataplus._M_p);
        sStack_2e0 = sStack_2e0 + local_318.name._M_string_length;
        local_298 = local_298 + local_318.name.field_2._M_allocated_capacity;
        sStack_290 = sStack_290 + local_318.name.field_2._8_8_;
        sVar24 = sVar24 + (long)local_318.tests.
                                super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                                ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        (**(code **)(*local_140 + 0x78))(local_140,*(undefined8 *)(p_Var20 + 1));
      }
      p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
    } while (p_Var20 != (_Base_ptr)local_70);
    auStack_2d0._8_8_ =
         local_318.tests.
         super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    auStack_2c0._8_8_ = local_298;
    auStack_2c0._0_8_ = sStack_2e0;
    auStack_2b0._8_8_ = sVar24;
    auStack_2b0._0_8_ = sStack_290;
  }
  auStack_2d0._0_8_ = pbVar26;
  uVar12 = local_40._0_8_;
  iVar14 = 0;
  for (auVar22 = auStack_48; auVar22 != (undefined1  [8])uVar12;
      auVar22 = (undefined1  [8])&(((element_type *)auVar22)->m_data).benchmarkWarmupTime) {
    if (*(double *)&(((element_type *)auVar22)->m_data).benchmarkSamples ==
        (((element_type *)auVar22)->m_data).benchmarkConfidenceInterval) {
      iVar14 = -1;
      (**(code **)(*local_140 + 0x18))(local_140,auVar22);
    }
  }
  local_2d8._0_4_ = iVar14;
  pTVar8 = local_318.tests.
           super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
           _M_impl.super__Vector_impl_data._M_finish[4];
  for (pTVar23 = local_318.tests.
                 super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[3]; pTVar23 != pTVar8;
      pTVar23 = (TestCase *)&(pTVar23->super_TestCaseInfo).className) {
    (**(code **)(*local_140 + 0x20))(local_140,pTVar23);
  }
  (**(code **)(*(long *)local_278._0_8_ + 0x20))(local_328);
  RunContext::testGroupEnded
            ((RunContext *)(local_278 + 0x10),(string *)local_328,(Totals *)local_2d8,1,1);
  psVar11 = local_280;
  if ((FilterMatch *)local_328._0_8_ != &local_318) {
    operator_delete((void *)local_328._0_8_);
  }
  iVar15 = (*(((psVar11->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
  iVar21 = 2;
  if (((byte)iVar15 & iVar14 == -1) == 0) {
    iVar15 = auStack_2d0._8_4_;
    if ((int)auStack_2d0._8_4_ <= iVar14) {
      iVar15 = local_2d8._0_4_;
    }
    iVar21 = 0xff;
    if (iVar15 < 0xff) {
      iVar21 = iVar15;
    }
  }
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          (local_50 + 8));
  clara::std::
  _Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
  ::~_Rb_tree((_Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
               *)local_78);
  RunContext::~RunContext((RunContext *)(local_278 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
  }
  return iVar21;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return static_cast<int>( *listed );

            TestGroup tests { m_config };
            auto const totals = tests.execute();

            if( m_config->warnAboutNoTests() && totals.error == -1 )
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }